

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_meshlink.c
# Opt level: O1

REF_STATUS ref_meshlink_parse(REF_GRID ref_grid,char *geom_filename)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  FILE *__stream;
  REF_NODE pRVar4;
  long lVar5;
  long lVar6;
  uint unaff_R14D;
  REF_INT gref;
  REF_INT nedge;
  REF_INT ntri;
  REF_INT new_cell;
  REF_DBL param [2];
  REF_INT nodes [27];
  REF_INT edges [2];
  char line [1024];
  uint local_4e4;
  uint local_4e0;
  uint local_4dc;
  REF_GEOM local_4d8;
  int local_4cc;
  REF_DBL local_4c8;
  undefined8 uStack_4c0;
  int local_4b8;
  int local_4b4;
  uint local_4b0;
  uint local_4ac;
  REF_INT local_440 [2];
  undefined4 local_438;
  short local_434;
  undefined1 uStack_432;
  
  local_4d8 = ref_grid->geom;
  local_4c8 = 0.0;
  uStack_4c0 = 0;
  if (geom_filename != (char *)0x0) {
    printf("parsing %s\n");
    __stream = fopen(geom_filename,"r");
    if (__stream == (FILE *)0x0) {
      printf("unable to open %s\n",geom_filename);
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_meshlink.c",
             0x7c,"ref_meshlink_parse","unable to open file");
      return 2;
    }
    iVar1 = feof(__stream);
    while ((iVar1 == 0 && (iVar1 = __isoc99_fscanf(__stream,"%s",&local_438), iVar1 != -1))) {
      if (iVar1 != 1) {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_meshlink.c",
               0x80,"ref_meshlink_parse","line read failed",1,(long)iVar1);
        return 1;
      }
      if (local_434 == 0x74 && local_438 == 0x65656873) {
        iVar1 = __isoc99_fscanf(__stream,"%d %d",&local_4dc,&local_4e4);
        if (iVar1 != 2) {
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_meshlink.c"
                 ,0x83,"ref_meshlink_parse","sheet size gref",2,(long)iVar1);
          return 1;
        }
        printf("sheet ntri %d gref %d\n",(ulong)local_4dc,(ulong)local_4e4);
        if (0 < (int)local_4dc) {
          iVar1 = 0;
          do {
            iVar3 = __isoc99_fscanf(__stream,"%d %d %d",&local_4b8,&local_4b4,&local_4b0);
            if (iVar3 != 3) {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_meshlink.c"
                     ,0x87,"ref_meshlink_parse","tri nodes",3,(long)iVar3);
              return 1;
            }
            local_4b8 = local_4b8 + -1;
            local_4b4 = local_4b4 + -1;
            local_4b0 = local_4b0 - 1;
            local_4ac = local_4e4;
            uVar2 = ref_cell_with(ref_grid->cell[3],&local_4b8,&local_4cc);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_meshlink.c"
                     ,0x8d,"ref_meshlink_parse",(ulong)uVar2,"tri for sheet missing");
              return uVar2;
            }
            ref_grid->cell[3]->c2n[(long)local_4cc * (long)ref_grid->cell[3]->size_per + 3] =
                 local_4ac;
            uVar2 = ref_geom_add(local_4d8,local_4b8,2,local_4ac,&local_4c8);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_meshlink.c"
                     ,0x90,"ref_meshlink_parse",(ulong)uVar2,"face uv");
              return uVar2;
            }
            uVar2 = ref_geom_add(local_4d8,local_4b4,2,local_4ac,&local_4c8);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_meshlink.c"
                     ,0x92,"ref_meshlink_parse",(ulong)uVar2,"face uv");
              return uVar2;
            }
            uVar2 = ref_geom_add(local_4d8,local_4b0,2,local_4ac,&local_4c8);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_meshlink.c"
                     ,0x94,"ref_meshlink_parse",(ulong)uVar2,"face uv");
              return uVar2;
            }
            iVar1 = iVar1 + 1;
          } while (iVar1 < (int)local_4dc);
        }
      }
      if (CONCAT13(uStack_432,CONCAT21(local_434,local_438._3_1_)) == 0x676e69 &&
          local_438 == 0x69727473) {
        iVar1 = __isoc99_fscanf(__stream,"%d %d",&local_4e0,&local_4e4);
        if (iVar1 != 2) {
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_meshlink.c"
                 ,0x99,"ref_meshlink_parse","string size gref",2,(long)iVar1);
          return 1;
        }
        printf("sheet ntri %d gref %d\n",(ulong)local_4e0,(ulong)local_4e4);
        if (0 < (int)local_4e0) {
          iVar1 = 0;
          do {
            iVar3 = __isoc99_fscanf(__stream,"%d %d",&local_4b8,&local_4b4);
            if (iVar3 != 2) {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_meshlink.c"
                     ,0x9c,"ref_meshlink_parse","edge nodes",2,(long)iVar3);
              return 1;
            }
            local_4b8 = local_4b8 + -1;
            local_4b4 = local_4b4 + -1;
            local_4b0 = local_4e4;
            uVar2 = ref_cell_add(ref_grid->cell[0],&local_4b8,&local_4cc);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_meshlink.c"
                     ,0xa1,"ref_meshlink_parse",(ulong)uVar2,"add edg for string");
              return uVar2;
            }
            uVar2 = ref_geom_add(local_4d8,local_4b8,1,local_4b0,&local_4c8);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_meshlink.c"
                     ,0xa3,"ref_meshlink_parse",(ulong)uVar2,"edge t");
              return uVar2;
            }
            uVar2 = ref_geom_add(local_4d8,local_4b4,1,local_4b0,&local_4c8);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_meshlink.c"
                     ,0xa5,"ref_meshlink_parse",(ulong)uVar2,"edge t");
              return uVar2;
            }
            iVar1 = iVar1 + 1;
          } while (iVar1 < (int)local_4e0);
        }
      }
      iVar1 = feof(__stream);
    }
    fclose(__stream);
    pRVar4 = ref_grid->node;
    if (0 < pRVar4->max) {
      lVar6 = 0;
      do {
        if (-1 < pRVar4->global[lVar6]) {
          uVar2 = ref_cell_id_list_around
                            (ref_grid->cell[0],(REF_INT)lVar6,2,(REF_INT *)&local_4e0,local_440);
          if ((uVar2 != 0) && (uVar2 != 7)) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_meshlink.c"
                   ,0xb2,"ref_meshlink_parse",(ulong)uVar2,"count edgeids");
            unaff_R14D = uVar2;
          }
          if ((uVar2 != 7) && (uVar2 != 0)) {
            return unaff_R14D;
          }
          if (1 < (int)local_4e0) {
            lVar5 = 0xffffffff;
            if ((lVar6 < ref_grid->node->max) && (lVar5 = ref_grid->node->global[lVar6], lVar5 < 0))
            {
              lVar5 = -1;
            }
            uVar2 = ref_geom_add(local_4d8,(REF_INT)lVar6,0,(REF_INT)lVar5,&local_4c8);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_meshlink.c"
                     ,0xb5,"ref_meshlink_parse",(ulong)uVar2,"node");
              return uVar2;
            }
          }
        }
        lVar6 = lVar6 + 1;
        pRVar4 = ref_grid->node;
      } while (lVar6 < pRVar4->max);
    }
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_meshlink_parse(REF_GRID ref_grid,
                                      const char *geom_filename) {
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  FILE *f = NULL;
  char line[1024];
  REF_INT tri, ntri, edge, nedge, gref, new_cell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  int status;
  REF_DBL param[2] = {0.0, 0.0};
  if (NULL == geom_filename) return REF_SUCCESS;
  printf("parsing %s\n", geom_filename);
  f = fopen(geom_filename, "r");
  if (NULL == (void *)f) printf("unable to open %s\n", geom_filename);
  RNS(f, "unable to open file");
  while (!feof(f)) {
    status = fscanf(f, "%s", line);
    if (EOF == status) break;
    REIS(1, status, "line read failed");

    if (0 == strcmp("sheet", line)) {
      REIS(2, fscanf(f, "%d %d", &ntri, &gref), "sheet size gref");
      printf("sheet ntri %d gref %d\n", ntri, gref);
      for (tri = 0; tri < ntri; tri++) {
        REIS(3, fscanf(f, "%d %d %d", &(nodes[0]), &(nodes[1]), &(nodes[2])),
             "tri nodes");
        (nodes[0])--;
        (nodes[1])--;
        (nodes[2])--;
        nodes[3] = gref;
        RSS(ref_cell_with(ref_grid_tri(ref_grid), nodes, &new_cell),
            "tri for sheet missing");
        ref_cell_c2n(ref_grid_tri(ref_grid), 3, new_cell) = nodes[3];
        RSS(ref_geom_add(ref_geom, nodes[0], REF_GEOM_FACE, nodes[3], param),
            "face uv");
        RSS(ref_geom_add(ref_geom, nodes[1], REF_GEOM_FACE, nodes[3], param),
            "face uv");
        RSS(ref_geom_add(ref_geom, nodes[2], REF_GEOM_FACE, nodes[3], param),
            "face uv");
      }
    }

    if (0 == strcmp("string", line)) {
      REIS(2, fscanf(f, "%d %d", &nedge, &gref), "string size gref");
      printf("sheet ntri %d gref %d\n", nedge, gref);
      for (edge = 0; edge < nedge; edge++) {
        REIS(2, fscanf(f, "%d %d", &(nodes[0]), &(nodes[1])), "edge nodes");
        (nodes[0])--;
        (nodes[1])--;
        nodes[2] = gref;
        RSS(ref_cell_add(ref_grid_edg(ref_grid), nodes, &new_cell),
            "add edg for string");
        RSS(ref_geom_add(ref_geom, nodes[0], REF_GEOM_EDGE, nodes[2], param),
            "edge t");
        RSS(ref_geom_add(ref_geom, nodes[1], REF_GEOM_EDGE, nodes[2], param),
            "edge t");
      }
    }
  }
  fclose(f);

  { /* mark cad nodes */
    REF_INT node;
    REF_INT edges[2];
    REF_INT id;
    each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
      RXS(ref_cell_id_list_around(ref_grid_edg(ref_grid), node, 2, &nedge,
                                  edges),
          REF_INCREASE_LIMIT, "count edgeids");
      if (nedge > 1) {
        id = (REF_INT)ref_node_global(ref_grid_node(ref_grid), node);
        RSS(ref_geom_add(ref_geom, node, REF_GEOM_NODE, id, param), "node");
      }
    }
  }

  return REF_SUCCESS;
}